

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void openSwitches(Graph *g,int *ids,int n)

{
  Edge *pEVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = 0;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pEVar1 = Graph::findEdge(g,ids[uVar3]);
    pEVar1->closed = false;
    pEVar1 = Graph::findEdge(g,pEVar1->destiny->id,pEVar1->origin->id);
    pEVar1->closed = false;
  }
  return;
}

Assistant:

void openSwitches(Graph *g, int *ids, int n) {
    Edge *a;
    for (int i = 0; i < n; i++) {
        a = g->findEdge(ids[i]);
        a->setSwitch(false);
        a = g->findEdge(a->getDestiny()->getID(), a->getOrigin()->getID());
        a->setSwitch(false);
    }
}